

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall Instance::enforceConstraints(Instance *this)

{
  pointer peVar1;
  pointer peVar2;
  expr constraint;
  ast local_38;
  
  peVar2 = (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
           super__Vector_impl_data._M_start;
  peVar1 = (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (peVar2 != peVar1) {
    do {
      local_38.super_object.m_ctx = (peVar2->super_ast).super_object.m_ctx;
      local_38.m_ast = (peVar2->super_ast).m_ast;
      Z3_inc_ref((local_38.super_object.m_ctx)->m_ctx);
      z3::optimize::add(&this->solver,(expr *)&local_38);
      z3::ast::~ast(&local_38);
      peVar2 = peVar2 + 1;
    } while (peVar2 != peVar1);
  }
  (*this->_vptr_Instance[2])(this);
  (*this->_vptr_Instance[1])(this);
  minimizeVss(this);
  return;
}

Assistant:

void Instance::enforceConstraints() {
  for (expr constraint : constraints)
    solver.add(constraint);

  enforceStopConstraint();
  enforceBoundaryConstraints();
  minimizeVss();
}